

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O1

int tjDecompressToYUV2(tjhandle handle,uchar *jpegBuf,unsigned_long jpegSize,uchar *dstBuf,int width
                      ,int pad,int height,int flags)

{
  j_decompress_ptr cinfo;
  int iVar1;
  uint subsamp;
  uint uVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  tjinstance *this;
  char *__src;
  size_t __n;
  long *in_FS_OFFSET;
  uchar *dstPlanes [3];
  int strides [3];
  uchar *local_58;
  uchar *local_50;
  uchar *puStack_48;
  unsigned_long local_38;
  
  if (handle == (tjhandle)0x0) {
    *(undefined8 *)((long)in_FS_OFFSET + -0xc9) = 0x656c646e616820;
    in_FS_OFFSET[-0x1a] = 0x2064696c61766e49;
  }
  else {
    *(undefined4 *)((long)handle + 0x5f8) = 0;
    *(undefined4 *)((long)handle + 0x6d0) = 0;
    *(uint *)((long)handle + 0x5fc) = (uint)flags >> 0xd & 1;
    if ((pad < 1 ||
         ((width < 0 || dstBuf == (uchar *)0x0) || (jpegSize == 0 || jpegBuf == (uchar *)0x0))) ||
       ((pad & pad - 1U) != 0 || height < 0)) {
      builtin_strncpy((char *)((long)handle + 0x618),"V2(): In",8);
      builtin_strncpy((char *)((long)handle + 0x620),"valid ar",8);
      builtin_strncpy((char *)((long)handle + 0x608),"tjDecomp",8);
      builtin_strncpy((char *)((long)handle + 0x610),"ressToYU",8);
      *(undefined8 *)((long)handle + 0x627) = 0x746e656d756772;
      *(undefined4 *)((long)handle + 0x6d0) = 1;
      *(undefined8 *)((long)in_FS_OFFSET + -0xb1) = 0x746e656d756772;
      in_FS_OFFSET[-0x18] = 0x6e49203a29283256;
      in_FS_OFFSET[-0x17] = 0x72612064696c6176;
      in_FS_OFFSET[-0x1a] = 0x706d6f6365446a74;
      in_FS_OFFSET[-0x19] = 0x55596f5473736572;
    }
    else {
      iVar1 = _setjmp((__jmp_buf_tag *)((long)handle + 0x528));
      if (iVar1 != 0) {
        return -1;
      }
      cinfo = (j_decompress_ptr)((long)handle + 0x208);
      local_38 = jpegSize;
      jpeg_mem_src_tj(cinfo,jpegBuf,jpegSize);
      jpeg_read_header(cinfo,1);
      subsamp = getSubsamp(cinfo);
      if ((int)subsamp < 0) {
        __src = "tjDecompressToYUV2(): Could not determine subsampling type for JPEG image";
        __n = 0x4a;
      }
      else {
        if (width == 0) {
          width = *(int *)((long)handle + 0x238);
        }
        if (height == 0) {
          height = *(int *)((long)handle + 0x23c);
        }
        lVar4 = 0;
        do {
          iVar1 = sf[lVar4].denom;
          if (((sf[lVar4].num * *(int *)((long)handle + 0x238) + iVar1 + -1) / iVar1 <= width) &&
             ((iVar1 + sf[lVar4].num * *(int *)((long)handle + 0x23c) + -1) / iVar1 <= height)) {
            uVar5 = (uint)lVar4;
            goto LAB_00110ef9;
          }
          lVar4 = lVar4 + 1;
        } while (lVar4 != 0x10);
        uVar5 = 0x10;
LAB_00110ef9:
        if (uVar5 < 0x10) {
          if (subsamp < 6 && 0 < width) {
            iVar1 = tjMCUWidth[subsamp];
            iVar3 = iVar1 + 7;
            if (-1 < iVar1) {
              iVar3 = iVar1;
            }
            uVar5 = -(iVar3 >> 3) & ((iVar3 >> 3) + width) - 1U;
          }
          else {
            in_FS_OFFSET[-0x18] = 0x2064696c61766e49;
            in_FS_OFFSET[-0x17] = 0x746e656d75677261;
            in_FS_OFFSET[-0x1a] = 0x57656e616c506a74;
            in_FS_OFFSET[-0x19] = 0x203a292868746469;
            *(undefined1 *)(in_FS_OFFSET + -0x16) = 0;
            uVar5 = 0xffffffff;
          }
          if (subsamp < 6 && 0 < height) {
            iVar1 = tjMCUHeight[subsamp];
            iVar3 = iVar1 + 7;
            if (-1 < iVar1) {
              iVar3 = iVar1;
            }
            uVar2 = -(iVar3 >> 3) & ((iVar3 >> 3) + height) - 1U;
          }
          else {
            in_FS_OFFSET[-0x18] = 0x64696c61766e4920;
            in_FS_OFFSET[-0x17] = 0x6e656d7567726120;
            in_FS_OFFSET[-0x1a] = 0x48656e616c506a74;
            in_FS_OFFSET[-0x19] = 0x3a29287468676965;
            *(undefined2 *)(in_FS_OFFSET + -0x16) = 0x74;
            uVar2 = 0xffffffff;
          }
          strides[0] = (uVar5 + pad) - 1 & -pad;
          local_58 = dstBuf;
          if (subsamp == 3) {
            strides[1] = 0;
            strides[2] = 0;
            local_50 = (uchar *)0x0;
            puStack_48 = (uchar *)0x0;
          }
          else {
            iVar1 = tjPlaneWidth(1,width,subsamp);
            iVar3 = tjPlaneHeight(1,height,subsamp);
            strides[2] = (iVar1 + pad) - 1U & -pad;
            strides[1] = strides[2];
            local_50 = local_58 + (long)(int)uVar2 * (long)strides[0];
            puStack_48 = local_50 + strides[2] * iVar3;
          }
          *(undefined4 *)((long)handle + 0x604) = 1;
          iVar1 = tjDecompressToYUVPlanes
                            (handle,jpegBuf,local_38,&local_58,width,strides,height,flags);
          return iVar1;
        }
        __src = "tjDecompressToYUV2(): Could not scale down to desired image dimensions";
        __n = 0x47;
      }
      memcpy((void *)((long)handle + 0x608),__src,__n);
      *(undefined4 *)((long)handle + 0x6d0) = 1;
      memcpy((void *)(*in_FS_OFFSET + -0xd0),__src,__n);
    }
    *(undefined4 *)((long)handle + 0x5fc) = 0;
  }
  return -1;
}

Assistant:

DLLEXPORT int tjDecompressToYUV2(tjhandle handle, const unsigned char *jpegBuf,
                                 unsigned long jpegSize, unsigned char *dstBuf,
                                 int width, int pad, int height, int flags)
{
  unsigned char *dstPlanes[3];
  int pw0, ph0, strides[3], retval = -1, jpegSubsamp = -1;
  int i, jpegwidth, jpegheight, scaledw, scaledh;

  GET_DINSTANCE(handle);
  this->jerr.stopOnWarning = (flags & TJFLAG_STOPONWARNING) ? TRUE : FALSE;

  if (jpegBuf == NULL || jpegSize <= 0 || dstBuf == NULL || width < 0 ||
      pad < 1 || !IS_POW2(pad) || height < 0)
    THROW("tjDecompressToYUV2(): Invalid argument");

  if (setjmp(this->jerr.setjmp_buffer)) {
    /* If we get here, the JPEG code has signaled an error. */
    return -1;
  }

  jpeg_mem_src_tj(dinfo, jpegBuf, jpegSize);
  jpeg_read_header(dinfo, TRUE);
  jpegSubsamp = getSubsamp(dinfo);
  if (jpegSubsamp < 0)
    THROW("tjDecompressToYUV2(): Could not determine subsampling type for JPEG image");

  jpegwidth = dinfo->image_width;  jpegheight = dinfo->image_height;
  if (width == 0) width = jpegwidth;
  if (height == 0) height = jpegheight;

  for (i = 0; i < NUMSF; i++) {
    scaledw = TJSCALED(jpegwidth, sf[i]);
    scaledh = TJSCALED(jpegheight, sf[i]);
    if (scaledw <= width && scaledh <= height)
      break;
  }
  if (i >= NUMSF)
    THROW("tjDecompressToYUV2(): Could not scale down to desired image dimensions");

  pw0 = tjPlaneWidth(0, width, jpegSubsamp);
  ph0 = tjPlaneHeight(0, height, jpegSubsamp);
  dstPlanes[0] = dstBuf;
  strides[0] = PAD(pw0, pad);
  if (jpegSubsamp == TJSAMP_GRAY) {
    strides[1] = strides[2] = 0;
    dstPlanes[1] = dstPlanes[2] = NULL;
  } else {
    int pw1 = tjPlaneWidth(1, width, jpegSubsamp);
    int ph1 = tjPlaneHeight(1, height, jpegSubsamp);

    strides[1] = strides[2] = PAD(pw1, pad);
    dstPlanes[1] = dstPlanes[0] + strides[0] * ph0;
    dstPlanes[2] = dstPlanes[1] + strides[1] * ph1;
  }

  this->headerRead = 1;
  return tjDecompressToYUVPlanes(handle, jpegBuf, jpegSize, dstPlanes, width,
                                 strides, height, flags);

bailout:
  this->jerr.stopOnWarning = FALSE;
  return retval;
}